

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# putkey.c
# Opt level: O0

int ffs2dt(char *datestr,int *year,int *month,int *day,int *status)

{
  int iVar1;
  size_t sVar2;
  ushort **ppuVar3;
  int local_48;
  int local_44;
  int lday;
  int lmonth;
  int lyear;
  int slen;
  int *status_local;
  int *day_local;
  int *month_local;
  int *year_local;
  char *datestr_local;
  
  if (*status < 1) {
    if (year != (int *)0x0) {
      *year = 0;
    }
    if (month != (int *)0x0) {
      *month = 0;
    }
    if (day != (int *)0x0) {
      *day = 0;
    }
    if (datestr == (char *)0x0) {
      ffpmsg("error: null input date string (ffs2dt)");
      *status = 0x1a4;
      datestr_local._4_4_ = 0x1a4;
    }
    else {
      sVar2 = strlen(datestr);
      iVar1 = (int)sVar2;
      if (((iVar1 == 8) && (datestr[2] == '/')) && (datestr[5] == '/')) {
        ppuVar3 = __ctype_b_loc();
        if ((((((*ppuVar3)[(int)*datestr] & 0x800) == 0) ||
             (ppuVar3 = __ctype_b_loc(), ((*ppuVar3)[(int)datestr[1]] & 0x800) == 0)) ||
            (ppuVar3 = __ctype_b_loc(), ((*ppuVar3)[(int)datestr[3]] & 0x800) == 0)) ||
           (((ppuVar3 = __ctype_b_loc(), ((*ppuVar3)[(int)datestr[4]] & 0x800) == 0 ||
             (ppuVar3 = __ctype_b_loc(), ((*ppuVar3)[(int)datestr[6]] & 0x800) == 0)) ||
            (ppuVar3 = __ctype_b_loc(), ((*ppuVar3)[(int)datestr[7]] & 0x800) == 0)))) {
          ffpmsg("input date string has illegal format (ffs2dt):");
          ffpmsg(datestr);
          *status = 0x1a4;
          return 0x1a4;
        }
        iVar1 = atoi(datestr + 6);
        lday = iVar1 + 0x76c;
        local_44 = atoi(datestr + 3);
        local_48 = atoi(datestr);
        if (year != (int *)0x0) {
          *year = lday;
        }
        if (month != (int *)0x0) {
          *month = local_44;
        }
        if (day != (int *)0x0) {
          *day = local_48;
        }
      }
      else {
        if (((iVar1 < 10) || (datestr[4] != '-')) || (datestr[7] != '-')) {
          ffpmsg("input date string has illegal format (ffs2dt):");
          ffpmsg(datestr);
          *status = 0x1a4;
          return 0x1a4;
        }
        ppuVar3 = __ctype_b_loc();
        if (((((*ppuVar3)[(int)*datestr] & 0x800) == 0) ||
            (ppuVar3 = __ctype_b_loc(), ((*ppuVar3)[(int)datestr[1]] & 0x800) == 0)) ||
           ((ppuVar3 = __ctype_b_loc(), ((*ppuVar3)[(int)datestr[2]] & 0x800) == 0 ||
            ((((ppuVar3 = __ctype_b_loc(), ((*ppuVar3)[(int)datestr[3]] & 0x800) == 0 ||
               (ppuVar3 = __ctype_b_loc(), ((*ppuVar3)[(int)datestr[5]] & 0x800) == 0)) ||
              (ppuVar3 = __ctype_b_loc(), ((*ppuVar3)[(int)datestr[6]] & 0x800) == 0)) ||
             ((ppuVar3 = __ctype_b_loc(), ((*ppuVar3)[(int)datestr[8]] & 0x800) == 0 ||
              (ppuVar3 = __ctype_b_loc(), ((*ppuVar3)[(int)datestr[9]] & 0x800) == 0)))))))) {
          ffpmsg("input date string has illegal format (ffs2dt):");
          ffpmsg(datestr);
          *status = 0x1a4;
          return 0x1a4;
        }
        if ((10 < iVar1) && (datestr[10] != 'T')) {
          ffpmsg("input date string has illegal format (ffs2dt):");
          ffpmsg(datestr);
          *status = 0x1a4;
          return 0x1a4;
        }
        lday = atoi(datestr);
        local_44 = atoi(datestr + 5);
        local_48 = atoi(datestr + 8);
        if (year != (int *)0x0) {
          *year = lday;
        }
        if (month != (int *)0x0) {
          *month = local_44;
        }
        if (day != (int *)0x0) {
          *day = local_48;
        }
      }
      iVar1 = ffverifydate(lday,local_44,local_48,status);
      if (0 < iVar1) {
        ffpmsg("invalid date (ffs2dt)");
      }
      datestr_local._4_4_ = *status;
    }
  }
  else {
    datestr_local._4_4_ = *status;
  }
  return datestr_local._4_4_;
}

Assistant:

int ffs2dt(char *datestr,   /* I - date string: "YYYY-MM-DD" or "dd/mm/yy" */
           int *year,       /* O - year (0 - 9999)                         */
           int *month,      /* O - month (1 - 12)                          */
           int *day,        /* O - day (1 - 31)                            */
           int   *status)   /* IO - error status                           */
/*
  Parse a date character string into year, month, and day values
*/
{
    int slen, lyear, lmonth, lday;

    if (*status > 0)           /* inherit input status value if > 0 */
        return(*status);

    if (year)
        *year = 0;
    if (month)
        *month = 0;
    if (day)
        *day   = 0;

    if (!datestr)
    {
        ffpmsg("error: null input date string (ffs2dt)");
        return(*status = BAD_DATE);   /* Null datestr pointer ??? */
    }

    slen = strlen(datestr);

    if (slen == 8 && datestr[2] == '/' && datestr[5] == '/')
    {
        if (isdigit((int) datestr[0]) && isdigit((int) datestr[1])
         && isdigit((int) datestr[3]) && isdigit((int) datestr[4])
         && isdigit((int) datestr[6]) && isdigit((int) datestr[7]) )
        {
            /* this is an old format string: "dd/mm/yy" */
            lyear  = atoi(&datestr[6]) + 1900;
            lmonth = atoi(&datestr[3]);
	    lday   = atoi(datestr);
	    
            if (year)
                *year = lyear;
            if (month)
                *month = lmonth;
            if (day)
                *day   = lday;
        }
        else
        {
            ffpmsg("input date string has illegal format (ffs2dt):");
            ffpmsg(datestr);
            return(*status = BAD_DATE);
        }
    }
    else if (slen >= 10 && datestr[4] == '-' && datestr[7] == '-')
        {
        if (isdigit((int) datestr[0]) && isdigit((int) datestr[1])
         && isdigit((int) datestr[2]) && isdigit((int) datestr[3])
         && isdigit((int) datestr[5]) && isdigit((int) datestr[6])
         && isdigit((int) datestr[8]) && isdigit((int) datestr[9]) )
        {
            if (slen > 10 && datestr[10] != 'T')
            {
                ffpmsg("input date string has illegal format (ffs2dt):");
                ffpmsg(datestr);
                return(*status = BAD_DATE);
            }

            /* this is a new format string: "yyyy-mm-dd" */
            lyear  = atoi(datestr);
            lmonth = atoi(&datestr[5]);
            lday   = atoi(&datestr[8]);

            if (year)
               *year  = lyear;
            if (month)
               *month = lmonth;
            if (day)
               *day   = lday;
        }
        else
        {
                ffpmsg("input date string has illegal format (ffs2dt):");
                ffpmsg(datestr);
                return(*status = BAD_DATE);
        }
    }
    else
    {
                ffpmsg("input date string has illegal format (ffs2dt):");
                ffpmsg(datestr);
                return(*status = BAD_DATE);
    }


    if (ffverifydate(lyear, lmonth, lday, status) > 0)
    {
        ffpmsg("invalid date (ffs2dt)");
    }

    return(*status);
}